

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspFacade::Statistics::Statistics(Statistics *this,ClaspFacade *f)

{
  this->self_ = f;
  (this->lp_).ptr_ = 0;
  SolverStats::SolverStats(&this->solvers_);
  (this->solver_).super_type.ebo_.buf = (pointer)0x0;
  (this->solver_).super_type.ebo_.size = 0;
  (this->solver_).super_type.ebo_.cap = 0;
  (this->solver_).own_ = true;
  (this->accu_).super_type.ebo_.buf = (pointer)0x0;
  (this->accu_).super_type.ebo_.size = 0;
  (this->accu_).super_type.ebo_.cap = 0;
  (this->accu_).own_ = true;
  this->tester_ = (TesterStats *)0x0;
  this->level_ = 0;
  this->clingo_ = (ClingoView *)0x0;
  return;
}

Assistant:

Statistics(ClaspFacade& f) : self_(&f), tester_(0), level_(0), clingo_(0) {}